

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

string * __thiscall
helics::CoreBroker::getNameList_abi_cxx11_(CoreBroker *this,string_view gidString)

{
  string_view delimiters;
  const_reference pvVar1;
  HandleManager *this_00;
  HandleManager *pHVar2;
  reference pvVar3;
  reference pvVar4;
  char *in_RCX;
  undefined8 in_RDX;
  string *in_RSI;
  GlobalHandle in_RDI;
  string_view in_stack_00000000;
  BasicHandleInfo *info;
  size_t index;
  vector<int,_std::allocator<int>_> val;
  string *nameString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  GlobalHandle fed_id;
  InterfaceHandle local_90;
  GlobalFederateId local_8c;
  GlobalHandle local_88;
  BasicHandleInfo *local_80;
  size_type local_78;
  undefined1 local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int defValue;
  GlobalHandle GVar5;
  
  defValue = (int)((ulong)in_RDX >> 0x20);
  fed_id = in_RDI;
  GVar5 = in_RDI;
  pvVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::back
                     ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8);
  if (*pvVar1 == ']') {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8,1);
  }
  pvVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front
                     ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8);
  if (*pvVar1 == '[') {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8,1);
  }
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff30,
             (char *)in_stack_ffffffffffffff28);
  delimiters._M_str = (char *)GVar5;
  delimiters._M_len = (size_t)in_RCX;
  gmlc::utilities::str2vector<int>(in_stack_00000000,defValue,delimiters);
  local_59 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffff30);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (in_stack_ffffffffffffff30,(char)((ulong)in_stack_ffffffffffffff28 >> 0x38));
  local_78 = 0;
  while( true ) {
    __c = (char)((ulong)in_stack_ffffffffffffff28 >> 0x38);
    this_00 = (HandleManager *)(local_78 + 1);
    pHVar2 = (HandleManager *)
             std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)&local_38);
    if (pHVar2 <= this_00) break;
    in_stack_ffffffffffffff20 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&in_RSI[0x21].field_2 + 8);
    in_stack_ffffffffffffff28 = &local_38;
    pvVar3 = CLI::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28,local_78);
    GlobalFederateId::GlobalFederateId(&local_8c,*pvVar3);
    pvVar3 = CLI::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28,local_78 + 1)
    ;
    InterfaceHandle::InterfaceHandle(&local_90,*pvVar3);
    GlobalHandle::GlobalHandle(&local_88,local_8c,local_90);
    local_80 = HandleManager::findHandle(this_00,fed_id);
    if (local_80 != (BasicHandleInfo *)0x0) {
      generateJsonQuotedString(in_RSI);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 in_stack_ffffffffffffff28);
      std::__cxx11::string::~string(in_stack_ffffffffffffff20);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                (char)((ulong)in_stack_ffffffffffffff28 >> 0x38));
    }
    local_78 = local_78 + 2;
  }
  pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           back(in_stack_ffffffffffffff20);
  if (*pvVar4 == ',') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (in_stack_ffffffffffffff20);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__c);
  local_59 = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return (string *)in_RDI;
}

Assistant:

std::string CoreBroker::getNameList(std::string_view gidString) const
{
    if (gidString.back() == ']') {
        gidString.remove_suffix(1);
    }
    if (gidString.front() == '[') {
        gidString.remove_prefix(1);
    }
    auto val = gmlc::utilities::str2vector<int>(gidString, -23, ",:;");
    std::string nameString;
    nameString.push_back('[');
    size_t index = 0;
    while (index + 1 < val.size()) {
        const auto* info = handles.findHandle(
            GlobalHandle(GlobalFederateId(val[index]), InterfaceHandle(val[index + 1])));
        if (info != nullptr) {
            nameString.append(generateJsonQuotedString(info->key));
            nameString.push_back(',');
        }

        index += 2;
    }
    if (nameString.back() == ',') {
        nameString.pop_back();
    }
    nameString.push_back(']');
    return nameString;
}